

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_lock.h
# Opt level: O2

void absl::lts_20240722::flags_internal::SequenceLock::RelaxedCopyToAtomic
               (atomic<unsigned_long> *dst,void *src,size_t size)

{
  long lVar1;
  uint64_t word;
  undefined8 local_20;
  
  lVar1 = 0;
  for (; 7 < size; size = size - 8) {
    *(undefined8 *)((long)&(dst->super___atomic_base<unsigned_long>)._M_i + lVar1) =
         *(undefined8 *)((long)src + lVar1);
    lVar1 = lVar1 + 8;
  }
  if (size != 0) {
    local_20 = 0;
    memcpy(&local_20,(void *)((long)src + lVar1),size);
    *(undefined8 *)((long)&(dst->super___atomic_base<unsigned_long>)._M_i + lVar1) = local_20;
  }
  return;
}

Assistant:

static void RelaxedCopyToAtomic(std::atomic<uint64_t>* dst, const void* src,
                                  size_t size) {
    const char* src_byte = static_cast<const char*>(src);
    while (size >= sizeof(uint64_t)) {
      uint64_t word;
      std::memcpy(&word, src_byte, sizeof(word));
      dst->store(word, std::memory_order_relaxed);
      src_byte += sizeof(word);
      dst++;
      size -= sizeof(word);
    }
    if (size > 0) {
      uint64_t word = 0;
      std::memcpy(&word, src_byte, size);
      dst->store(word, std::memory_order_relaxed);
    }
  }